

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O0

void __thiscall Manifold_RevolveClip_Test::TestBody(Manifold_RevolveClip_Test *this)

{
  allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_> *this_00
  ;
  initializer_list<linalg::vec<double,_2>_> __l;
  initializer_list<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>
  __l_00;
  initializer_list<linalg::vec<double,_2>_> __l_01;
  initializer_list<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>
  __l_02;
  bool bVar1;
  char *pcVar2;
  vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> *local_238;
  vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> *local_208;
  AssertHelper local_1e8;
  Message local_1e0;
  double local_1d8;
  double local_1d0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_2;
  Message local_1b0;
  double local_1a8;
  double local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_1;
  Message local_180;
  int local_178;
  int local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar;
  Manifold second;
  vector local_150 [8];
  Manifold first;
  allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>
  local_13b;
  undefined1 local_13a;
  allocator<linalg::vec<double,_2>_> local_139;
  vec<double,_2> local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  iterator local_108;
  size_type local_100;
  vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> *local_f8;
  vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> local_f0;
  undefined1 local_d8 [24];
  Polygons clipped;
  allocator<linalg::vec<double,_2>_> local_99;
  vec<double,_2> local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  iterator local_68;
  size_type local_60;
  vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> *local_58;
  vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> local_50;
  undefined1 local_38 [24];
  Polygons polys;
  Manifold_RevolveClip_Test *this_local;
  
  clipped.
  super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  local_78 = 0xc014000000000000;
  uStack_70 = 0x4024000000000000;
  local_88 = 0x4014000000000000;
  uStack_80 = 0;
  local_98.x = -5.0;
  local_98.y = -10.0;
  local_68 = &local_98;
  local_60 = 3;
  local_58 = &local_50;
  polys.
  super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<linalg::vec<double,_2>_>::allocator(&local_99);
  __l_01._M_len = local_60;
  __l_01._M_array = local_68;
  std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>::vector
            (&local_50,__l_01,&local_99);
  clipped.
  super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  local_38._0_8_ = &local_50;
  local_38._8_8_ = (pointer)0x1;
  this_00 = (allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>
             *)((long)&clipped.
                       super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 2);
  std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>::
  allocator(this_00);
  __l_02._M_len = local_38._8_8_;
  __l_02._M_array = (iterator)local_38._0_8_;
  std::
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ::vector((vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
            *)(local_38 + 0x10),__l_02,this_00);
  std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>::
  ~allocator((allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>
              *)((long)&clipped.
                        super__Vector_base<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  local_208 = (vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> *)local_38;
  do {
    local_208 = local_208 + -1;
    std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>::~vector
              (local_208);
  } while (local_208 != &local_50);
  std::allocator<linalg::vec<double,_2>_>::~allocator(&local_99);
  local_13a = 1;
  local_118 = 0;
  uStack_110 = 0x4014000000000000;
  local_128 = 0x4014000000000000;
  uStack_120 = 0;
  local_138.x = 0.0;
  local_138.y = -5.0;
  local_108 = &local_138;
  local_100 = 3;
  local_f8 = &local_f0;
  std::allocator<linalg::vec<double,_2>_>::allocator(&local_139);
  __l._M_len = local_100;
  __l._M_array = local_108;
  std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>::vector
            (&local_f0,__l,&local_139);
  local_13a = 0;
  local_d8._0_8_ = &local_f0;
  local_d8._8_8_ = (pointer)0x1;
  std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>::
  allocator(&local_13b);
  __l_00._M_len = local_d8._8_8_;
  __l_00._M_array = (iterator)local_d8._0_8_;
  std::
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ::vector((vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
            *)(local_d8 + 0x10),__l_00,&local_13b);
  std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>::
  ~allocator(&local_13b);
  local_238 = (vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> *)local_d8;
  do {
    local_238 = local_238 + -1;
    std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>::~vector
              (local_238);
  } while (local_238 != &local_f0);
  std::allocator<linalg::vec<double,_2>_>::~allocator(&local_139);
  manifold::Manifold::Revolve(local_150,(int)local_38 + 0x10,360.0);
  manifold::Manifold::Revolve((vector *)&gtest_ar.message_,(int)local_d8 + 0x10,360.0);
  local_174 = manifold::Manifold::Genus();
  local_178 = manifold::Manifold::Genus();
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_170,"first.Genus()","second.Genus()",&local_174,&local_178);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x148,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  local_1a0 = (double)manifold::Manifold::Volume();
  local_1a8 = (double)manifold::Manifold::Volume();
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_198,"first.Volume()","second.Volume()",&local_1a0,&local_1a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x149,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  local_1d0 = (double)manifold::Manifold::SurfaceArea();
  local_1d8 = (double)manifold::Manifold::SurfaceArea();
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1c8,"first.SurfaceArea()","second.SurfaceArea()",&local_1d0,
             &local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x14a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  manifold::Manifold::~Manifold((Manifold *)&gtest_ar.message_);
  manifold::Manifold::~Manifold((Manifold *)local_150);
  std::
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ::~vector((vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
             *)(local_d8 + 0x10));
  std::
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ::~vector((vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
             *)(local_38 + 0x10));
  return;
}

Assistant:

TEST(Manifold, RevolveClip) {
  Polygons polys = {{{-5, -10}, {5, 0}, {-5, 10}}};
  Polygons clipped = {{{0, -5}, {5, 0}, {0, 5}}};
  Manifold first = Manifold::Revolve(polys, 48);
  Manifold second = Manifold::Revolve(clipped, 48);
  EXPECT_EQ(first.Genus(), second.Genus());
  EXPECT_EQ(first.Volume(), second.Volume());
  EXPECT_EQ(first.SurfaceArea(), second.SurfaceArea());
}